

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper.cc
# Opt level: O1

FeatureSet * __thiscall
google::protobuf::internal::InternalFeatureHelper::ParseAndGetEditionResolvedFeatureSet
          (FeatureSet *__return_storage_ptr__,InternalFeatureHelper *this,string_view data,
          Edition edition)

{
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  Nonnull<std::string_*> dest;
  string_view src;
  string_view data_00;
  string unescaped_data;
  FeatureSetDefaults defaults;
  StatusOr<google::protobuf::FeatureSet> edition_feature_set;
  char *local_f8;
  size_t local_f0;
  char local_e8;
  undefined7 uStack_e7;
  LogMessageFatal local_d8;
  LogMessageFatal local_c8;
  FeatureSetDefaults local_b8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_80;
  FeatureSet local_78;
  
  dest = (Nonnull<std::string_*>)data._M_str;
  FeatureSetDefaults::FeatureSetDefaults(&local_b8,(Arena *)0x0);
  local_f0 = 0;
  local_e8 = '\0';
  src._M_str = (char *)&local_f8;
  src._M_len = data._M_len;
  local_f8 = &local_e8;
  absl::lts_20250127::Base64Unescape((lts_20250127 *)this,src,dest);
  data_00._M_str = local_f8;
  data_00._M_len = local_f0;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&local_b8,data_00);
  if ((!bVar1) &&
     (absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper.cc"
                 ,0x15,"defaults.ParseFromString(unescaped_data)"), !bVar1)) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_c8);
  }
  GetEditionFeatureSetDefaults
            ((StatusOr<google::protobuf::FeatureSet> *)&local_80.status_,(Edition)data._M_str,
             &local_b8);
  if (local_80 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1) {
    FeatureSet::FeatureSet(__return_storage_ptr__,(Arena *)0x0,&local_78);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::~StatusOrData
              ((StatusOrData<google::protobuf::FeatureSet> *)&local_80.status_);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
    }
    FeatureSetDefaults::~FeatureSetDefaults(&local_b8);
    return __return_storage_ptr__;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          (&local_80.status_,"edition_feature_set is OK");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper.cc"
             ,0x17,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_d8);
}

Assistant:

FeatureSet InternalFeatureHelper::ParseAndGetEditionResolvedFeatureSet(
    absl::string_view data, Edition edition) {
  FeatureSetDefaults defaults;
  std::string unescaped_data;
  absl::Base64Unescape(data, &unescaped_data);
  ABSL_CHECK(defaults.ParseFromString(unescaped_data));
  auto edition_feature_set = GetEditionFeatureSetDefaults(edition, defaults);
  ABSL_CHECK_OK(edition_feature_set);
  return *edition_feature_set;
}